

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeMemTranslate(Mem *pMem,u8 desiredEnc)

{
  ushort uVar1;
  int iVar2;
  sqlite3 *psVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ushort *puVar7;
  uint *puVar8;
  uint *puVar9;
  byte bVar10;
  undefined7 in_register_00000031;
  uint uVar11;
  byte *pbVar12;
  long lVar13;
  ushort *puVar14;
  ushort *puVar15;
  
  if (((int)CONCAT71(in_register_00000031,desiredEnc) == 1) || (pMem->enc == '\x01')) {
    if (desiredEnc == '\x01') {
      uVar5 = pMem->n & 0xfffffffe;
      pMem->n = uVar5;
      iVar4 = uVar5 * 2 + 1;
    }
    else {
      iVar4 = pMem->n * 2 + 2;
    }
    puVar14 = (ushort *)pMem->z;
    iVar2 = pMem->n;
    if (pMem->db == (sqlite3 *)0x0) {
      puVar8 = (uint *)sqlite3Malloc((long)iVar4);
    }
    else {
      puVar8 = (uint *)sqlite3DbMallocRawNN(pMem->db,(long)iVar4);
    }
    if (puVar8 == (uint *)0x0) {
      return 7;
    }
    puVar7 = (ushort *)((long)iVar2 + (long)puVar14);
    if (pMem->enc == '\x01') {
      puVar9 = puVar8;
      if (desiredEnc == '\x02') {
        if (0 < iVar2) {
          do {
            bVar10 = (byte)*puVar14;
            uVar6 = (ulong)bVar10;
            puVar14 = (ushort *)((long)puVar14 + 1);
            if (0xbf < bVar10) {
              uVar5 = (uint)""[bVar10 - 0xc0];
              while ((puVar14 != puVar7 && (uVar1 = *puVar14, ((byte)uVar1 & 0xffffffc0) == 0x80)))
              {
                puVar14 = (ushort *)((long)puVar14 + 1);
                uVar5 = uVar5 << 6 | (byte)uVar1 & 0x3f;
              }
              uVar6 = (ulong)uVar5;
              if ((uVar5 & 0xfffff800) == 0xd800) {
                uVar6 = 0xfffd;
              }
              if (uVar5 < 0x80) {
                uVar6 = 0xfffd;
              }
              if ((uVar5 & 0xfffffffe) == 0xfffe) {
                uVar6 = 0xfffd;
              }
            }
            if ((uint)uVar6 < 0x10000) {
              *(short *)puVar9 = (short)uVar6;
              puVar9 = (uint *)((long)puVar9 + 2);
            }
            else {
              uVar5 = (uint)uVar6 - 0x10000;
              *(byte *)puVar9 = (byte)(uVar5 >> 10) & 0xc0 | (byte)(uVar6 >> 10) & 0x3f;
              *(byte *)((long)puVar9 + 1) = (byte)(uVar5 >> 0x12) & 3 | 0xd8;
              *(byte *)((long)puVar9 + 2) = (byte)uVar6;
              *(byte *)((long)puVar9 + 3) = (byte)(uVar6 >> 8) & 3 | 0xdc;
              puVar9 = puVar9 + 1;
            }
          } while (puVar14 < puVar7);
        }
      }
      else if (0 < iVar2) {
        do {
          bVar10 = (byte)*puVar14;
          uVar5 = (uint)bVar10;
          puVar14 = (ushort *)((long)puVar14 + 1);
          if (0xbf < bVar10) {
            uVar11 = (uint)""[bVar10 - 0xc0];
            while ((puVar14 != puVar7 && (uVar1 = *puVar14, ((byte)uVar1 & 0xffffffc0) == 0x80))) {
              puVar14 = (ushort *)((long)puVar14 + 1);
              uVar11 = uVar11 << 6 | (byte)uVar1 & 0x3f;
            }
            uVar5 = uVar11;
            if ((uVar11 & 0xfffff800) == 0xd800) {
              uVar5 = 0xfffd;
            }
            if (uVar11 < 0x80) {
              uVar5 = 0xfffd;
            }
            if ((uVar11 & 0xfffffffe) == 0xfffe) {
              uVar5 = 0xfffd;
            }
          }
          bVar10 = (byte)(uVar5 >> 8);
          if (uVar5 < 0x10000) {
            pbVar12 = (byte *)((long)puVar9 + 1);
            *(byte *)puVar9 = bVar10;
            lVar13 = 2;
          }
          else {
            *(byte *)puVar9 = (byte)(uVar5 - 0x10000 >> 0x12) & 3 | 0xd8;
            *(byte *)((long)puVar9 + 1) =
                 (byte)(uVar5 - 0x10000 >> 10) & 0xc0 | (byte)(uVar5 >> 10) & 0x3f;
            pbVar12 = (byte *)((long)puVar9 + 3);
            *(byte *)((long)puVar9 + 2) = bVar10 & 3 | 0xdc;
            lVar13 = 4;
          }
          puVar9 = (uint *)((long)puVar9 + lVar13);
          *pbVar12 = (byte)uVar5;
        } while (puVar14 < puVar7);
      }
      pMem->n = (int)puVar9 - (int)puVar8;
      *(byte *)puVar9 = 0;
      puVar9 = (uint *)((long)puVar9 + 1);
    }
    else {
      puVar9 = puVar8;
      if (pMem->enc == '\x02') {
        if (0 < iVar2) {
          do {
            puVar15 = puVar14 + 1;
            uVar5 = (uint)*puVar14;
            if (puVar15 < puVar7 && (*puVar14 & 0xf800) == 0xd800) {
              puVar15 = puVar14 + 2;
              uVar5 = ((uVar5 & 0x3c0 | (byte)*puVar14 & 0x3f) << 10 | (uint)(byte)puVar14[1]) +
                      (*(byte *)((long)puVar14 + 3) & 3) * 0x100 + 0x10000;
            }
            bVar10 = (byte)uVar5;
            if (uVar5 < 0x80) {
              *(byte *)puVar9 = bVar10;
              puVar9 = (uint *)((long)puVar9 + 1);
            }
            else if (uVar5 < 0x800) {
              *(byte *)puVar9 = (byte)(uVar5 >> 6) | 0xc0;
              *(byte *)((long)puVar9 + 1) = bVar10 & 0x3f | 0x80;
              puVar9 = (uint *)((long)puVar9 + 2);
            }
            else if (uVar5 < 0x10000) {
              *(byte *)puVar9 = (byte)(uVar5 >> 0xc) | 0xe0;
              *(byte *)((long)puVar9 + 1) = (byte)(uVar5 >> 6) & 0x3f | 0x80;
              *(byte *)((long)puVar9 + 2) = bVar10 & 0x3f | 0x80;
              puVar9 = (uint *)((long)puVar9 + 3);
            }
            else {
              *puVar9 = (uVar5 << 0x18 |
                        (uVar5 & 0x3fc0) << 10 | uVar5 >> 4 & 0xff00 | uVar5 >> 0x12) & 0x3f3f3f07 |
                        0x808080f0;
              puVar9 = puVar9 + 1;
            }
            puVar14 = puVar15;
          } while (puVar15 < puVar7);
        }
      }
      else if (0 < iVar2) {
        do {
          puVar15 = puVar14 + 1;
          uVar5 = (uint)CONCAT11((byte)*puVar14,*(byte *)((long)puVar14 + 1));
          if (puVar15 < puVar7 && ((byte)*puVar14 & 0xf8) == 0xd8) {
            puVar15 = puVar14 + 2;
            uVar5 = ((uVar5 & 0x3c0 | *(byte *)((long)puVar14 + 1) & 0x3f) << 10 |
                    (uint)*(byte *)((long)puVar14 + 3)) + ((byte)puVar14[1] & 3) * 0x100 + 0x10000;
          }
          bVar10 = (byte)uVar5;
          if (uVar5 < 0x80) {
            *(byte *)puVar9 = bVar10;
            puVar9 = (uint *)((long)puVar9 + 1);
          }
          else if (uVar5 < 0x800) {
            *(byte *)puVar9 = (byte)(uVar5 >> 6) | 0xc0;
            *(byte *)((long)puVar9 + 1) = bVar10 & 0x3f | 0x80;
            puVar9 = (uint *)((long)puVar9 + 2);
          }
          else if (uVar5 < 0x10000) {
            *(byte *)puVar9 = (byte)(uVar5 >> 0xc) | 0xe0;
            *(byte *)((long)puVar9 + 1) = (byte)(uVar5 >> 6) & 0x3f | 0x80;
            *(byte *)((long)puVar9 + 2) = bVar10 & 0x3f | 0x80;
            puVar9 = (uint *)((long)puVar9 + 3);
          }
          else {
            *puVar9 = (uVar5 << 0x18 | (uVar5 & 0x3fc0) << 10 | uVar5 >> 4 & 0xff00 | uVar5 >> 0x12)
                      & 0x3f3f3f07 | 0x808080f0;
            puVar9 = puVar9 + 1;
          }
          puVar14 = puVar15;
        } while (puVar15 < puVar7);
      }
      pMem->n = (int)puVar9 - (int)puVar8;
    }
    *(byte *)puVar9 = 0;
    uVar1 = pMem->flags;
    if (((uVar1 & 0x2400) != 0) || (pMem->szMalloc != 0)) {
      vdbeMemClear(pMem);
    }
    pMem->flags = uVar1 & 0x801d | 0x202;
    pMem->enc = desiredEnc;
    pMem->z = (char *)puVar8;
    pMem->zMalloc = (char *)puVar8;
    psVar3 = pMem->db;
    if (((psVar3 == (sqlite3 *)0x0) || (puVar8 < (psVar3->lookaside).pStart)) ||
       ((psVar3->lookaside).pEnd <= puVar8)) {
      uVar5 = (*sqlite3Config.m.xSize)(puVar8);
    }
    else {
      uVar5 = (uint)(psVar3->lookaside).sz;
    }
    pMem->szMalloc = uVar5;
  }
  else {
    iVar4 = sqlite3VdbeMemMakeWriteable(pMem);
    if (iVar4 != 0) {
      return 7;
    }
    uVar6 = (long)pMem->n & 0xfffffffffffffffe;
    if (0 < (int)uVar6) {
      puVar14 = (ushort *)pMem->z;
      puVar7 = (ushort *)(uVar6 + (long)puVar14);
      do {
        *puVar14 = *puVar14 << 8 | *puVar14 >> 8;
        puVar14 = puVar14 + 1;
      } while (puVar14 < puVar7);
    }
    pMem->enc = desiredEnc;
  }
  return 0;
}

Assistant:

int sqlite3VdbeMemTranslate(Mem *pMem, u8 desiredEnc){
  int len;                    /* Maximum length of output string in bytes */
  unsigned char *zOut;                  /* Output buffer */
  unsigned char *zIn;                   /* Input iterator */
  unsigned char *zTerm;                 /* End of input */
  unsigned char *z;                     /* Output iterator */
  unsigned int c;

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( pMem->flags&MEM_Str );
  assert( pMem->enc!=desiredEnc );
  assert( pMem->enc!=0 );
  assert( pMem->n>=0 );

#if defined(TRANSLATE_TRACE) && defined(SQLITE_DEBUG)
  {
    char zBuf[100];
    sqlite3VdbeMemPrettyPrint(pMem, zBuf);
    fprintf(stderr, "INPUT:  %s\n", zBuf);
  }
#endif

  /* If the translation is between UTF-16 little and big endian, then 
  ** all that is required is to swap the byte order. This case is handled
  ** differently from the others.
  */
  if( pMem->enc!=SQLITE_UTF8 && desiredEnc!=SQLITE_UTF8 ){
    u8 temp;
    int rc;
    rc = sqlite3VdbeMemMakeWriteable(pMem);
    if( rc!=SQLITE_OK ){
      assert( rc==SQLITE_NOMEM );
      return SQLITE_NOMEM_BKPT;
    }
    zIn = (u8*)pMem->z;
    zTerm = &zIn[pMem->n&~1];
    while( zIn<zTerm ){
      temp = *zIn;
      *zIn = *(zIn+1);
      zIn++;
      *zIn++ = temp;
    }
    pMem->enc = desiredEnc;
    goto translate_out;
  }

  /* Set len to the maximum number of bytes required in the output buffer. */
  if( desiredEnc==SQLITE_UTF8 ){
    /* When converting from UTF-16, the maximum growth results from
    ** translating a 2-byte character to a 4-byte UTF-8 character.
    ** A single byte is required for the output string
    ** nul-terminator.
    */
    pMem->n &= ~1;
    len = pMem->n * 2 + 1;
  }else{
    /* When converting from UTF-8 to UTF-16 the maximum growth is caused
    ** when a 1-byte UTF-8 character is translated into a 2-byte UTF-16
    ** character. Two bytes are required in the output buffer for the
    ** nul-terminator.
    */
    len = pMem->n * 2 + 2;
  }

  /* Set zIn to point at the start of the input buffer and zTerm to point 1
  ** byte past the end.
  **
  ** Variable zOut is set to point at the output buffer, space obtained
  ** from sqlite3_malloc().
  */
  zIn = (u8*)pMem->z;
  zTerm = &zIn[pMem->n];
  zOut = sqlite3DbMallocRaw(pMem->db, len);
  if( !zOut ){
    return SQLITE_NOMEM_BKPT;
  }
  z = zOut;

  if( pMem->enc==SQLITE_UTF8 ){
    if( desiredEnc==SQLITE_UTF16LE ){
      /* UTF-8 -> UTF-16 Little-endian */
      while( zIn<zTerm ){
        READ_UTF8(zIn, zTerm, c);
        WRITE_UTF16LE(z, c);
      }
    }else{
      assert( desiredEnc==SQLITE_UTF16BE );
      /* UTF-8 -> UTF-16 Big-endian */
      while( zIn<zTerm ){
        READ_UTF8(zIn, zTerm, c);
        WRITE_UTF16BE(z, c);
      }
    }
    pMem->n = (int)(z - zOut);
    *z++ = 0;
  }else{
    assert( desiredEnc==SQLITE_UTF8 );
    if( pMem->enc==SQLITE_UTF16LE ){
      /* UTF-16 Little-endian -> UTF-8 */
      while( zIn<zTerm ){
        READ_UTF16LE(zIn, zIn<zTerm, c); 
        WRITE_UTF8(z, c);
      }
    }else{
      /* UTF-16 Big-endian -> UTF-8 */
      while( zIn<zTerm ){
        READ_UTF16BE(zIn, zIn<zTerm, c); 
        WRITE_UTF8(z, c);
      }
    }
    pMem->n = (int)(z - zOut);
  }
  *z = 0;
  assert( (pMem->n+(desiredEnc==SQLITE_UTF8?1:2))<=len );

  c = pMem->flags;
  sqlite3VdbeMemRelease(pMem);
  pMem->flags = MEM_Str|MEM_Term|(c&(MEM_AffMask|MEM_Subtype));
  pMem->enc = desiredEnc;
  pMem->z = (char*)zOut;
  pMem->zMalloc = pMem->z;
  pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->z);

translate_out:
#if defined(TRANSLATE_TRACE) && defined(SQLITE_DEBUG)
  {
    char zBuf[100];
    sqlite3VdbeMemPrettyPrint(pMem, zBuf);
    fprintf(stderr, "OUTPUT: %s\n", zBuf);
  }
#endif
  return SQLITE_OK;
}